

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Types TVar2;
  ulong *puVar3;
  long lVar4;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  ExecutionModel EVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  SPIRType *pSVar12;
  SPIRType *pSVar13;
  undefined4 extraout_var;
  undefined8 *puVar14;
  undefined4 extraout_var_00;
  long *plVar15;
  ulong uVar16;
  SPIRVariable *var;
  runtime_error *prVar17;
  size_type *psVar18;
  ulong *puVar19;
  CompilerMSL *pCVar20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  AccessChainMeta meta;
  string expr;
  uint32_t indices [2];
  string local_140;
  SPIRType *local_120;
  AccessChainMeta local_118;
  ulong local_108;
  long lStack_100;
  uint32_t local_f4;
  CompilerMSL *local_f0;
  ulong local_e8;
  uint32_t local_dc;
  SPIRType *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  uint32_t local_6c;
  SPIRType *local_68;
  SPIRType *local_60;
  uint32_t local_54;
  SPIRType *local_50;
  uint32_t local_44;
  SPIRVariable *local_40;
  ulong local_38;
  
  local_54 = id;
  pSVar12 = Compiler::expression_type((Compiler *)this,ptr);
  pSVar13 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + result_type_id);
  local_50 = pSVar12;
  if (((pSVar12->storage != Input) &&
      ((pSVar12->storage != Output ||
       (EVar8 = Compiler::get_execution_model((Compiler *)this),
       EVar8 == ExecutionModelTessellationEvaluation)))) ||
     (bVar6 = Compiler::has_decoration((Compiler *)this,(ID)ptr,DecorationPatch), bVar6)) {
    return false;
  }
  TVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[ptr].type;
  local_120 = pSVar13;
  local_44 = result_type_id;
  bVar6 = variable_storage_requires_stage_io(this,local_50->storage);
  pSVar12 = local_120;
  local_f0 = this;
  local_dc = ptr;
  if (bVar6) {
    bVar7 = Compiler::is_matrix((Compiler *)this,local_120);
    bVar25 = true;
    if ((!bVar7) && (bVar7 = Compiler::is_array((Compiler *)this,pSVar12), !bVar7)) {
      bVar25 = pSVar12->basetype == Struct;
    }
  }
  else {
    bVar25 = false;
  }
  uVar10 = local_dc;
  if (TVar2 == TypeVariable) {
    bVar7 = Compiler::is_array((Compiler *)local_f0,pSVar12);
    if (!bVar7 && !bVar25) {
      return false;
    }
  }
  else if (!bVar25) {
    return false;
  }
  pCVar20 = local_f0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  uVar9 = Compiler::get_extended_decoration
                    ((Compiler *)local_f0,uVar10,SPIRVCrossDecorationInterfaceMemberIndex);
  local_e8 = CONCAT44(extraout_var,uVar9);
  local_40 = Compiler::maybe_get_backing_variable((Compiler *)pCVar20,uVar10);
  local_68 = Compiler::get_pointee_type((Compiler *)pCVar20,(local_50->super_IVariant).self.id);
  local_60 = Compiler::expression_type((Compiler *)pCVar20,(pCVar20->stage_in_ptr_var_id).id);
  pCVar20 = local_f0;
  if (bVar6) {
    uVar24 = (local_120->array).super_VectorView<unsigned_int>.buffer_size;
    if (2 < uVar24) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar17,"Cannot load tessellation IO variables with more than 2 dimensions.");
      goto LAB_0022d8dd;
    }
    if (uVar24 == 2) {
      if (TVar2 != TypeVariable) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"Loading an array-of-array must be loaded directly from an IO variable.")
        ;
        goto LAB_0022d8dd;
      }
      if ((int)local_e8 == -1) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar17,"Interface index is unknown. Cannot continue.");
        goto LAB_0022d8dd;
      }
      if (local_120->basetype != Struct) {
        bVar6 = Compiler::is_matrix((Compiler *)local_f0,local_120);
        if (!bVar6) {
          (*(pCVar20->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_118,pCVar20,local_120,0);
          puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
          psVar18 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_140.field_2._M_allocated_capacity = *psVar18;
            local_140.field_2._8_8_ = puVar14[3];
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar18;
            local_140._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_140._M_string_length = puVar14[1];
          *puVar14 = psVar18;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
            operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
          }
          pSVar12 = local_120;
          uVar10 = CompilerGLSL::to_array_size_literal(&pCVar20->super_CompilerGLSL,local_120,1);
          local_d8 = (SPIRType *)CONCAT44(local_d8._4_4_,uVar10);
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((pCVar20->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (pSVar12->parent_type).id);
          if ((uint)local_d8 != 0) {
            local_f4 = 0;
            do {
              pCVar20 = local_f0;
              (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_118,local_f0,pSVar12,0);
              puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
              psVar18 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_140.field_2._M_allocated_capacity = *psVar18;
                local_140.field_2._8_8_ = puVar14[3];
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar18;
                local_140._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_140._M_string_length = puVar14[1];
              *puVar14 = psVar18;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
                operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
              }
              uVar10 = CompilerGLSL::to_array_size_literal(&pCVar20->super_CompilerGLSL,local_120,0)
              ;
              if (uVar10 != 0) {
                uVar24 = local_e8 & 0xffffffff;
                uVar23 = 1;
                do {
                  local_90._M_dataplus._M_p._0_4_ = local_f4;
                  local_118.builtin = BuiltInPosition;
                  local_118.storage_physical_type = 0;
                  local_118.need_transpose = false;
                  local_118.storage_is_packed = false;
                  local_118.storage_is_invariant = false;
                  local_118.flattened_struct = false;
                  local_118.relaxed_precision = false;
                  local_118.access_meshlet_position_y = false;
                  local_118.chain_is_builtin = false;
                  local_90._M_dataplus._M_p._4_4_ = (uint32_t)uVar24;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_140,&local_f0->super_CompilerGLSL,
                             (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,&local_118
                            );
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != &local_140.field_2) {
                    operator_delete(local_140._M_dataplus._M_p);
                  }
                  bVar6 = Compiler::is_matrix((Compiler *)local_f0,pSVar12);
                  if ((!bVar6 && pSVar12->basetype != Struct) &&
                     (pSVar12->vecsize < local_68->vecsize)) {
                    CompilerGLSL::vector_swizzle(pSVar12->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b0);
                  }
                  if (uVar23 < uVar10) {
                    ::std::__cxx11::string::append((char *)&local_b0);
                  }
                  uVar24 = (ulong)((uint32_t)uVar24 + 1);
                  bVar6 = uVar23 != uVar10;
                  uVar23 = uVar23 + 1;
                } while (bVar6);
              }
              ::std::__cxx11::string::append((char *)&local_b0);
              local_f4 = local_f4 + 1;
              if (local_f4 < (uint)local_d8) {
                ::std::__cxx11::string::append((char *)&local_b0);
              }
            } while (local_f4 != (uint)local_d8);
          }
          ::std::__cxx11::string::append((char *)&local_b0);
          goto LAB_0022d7c3;
        }
      }
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar17,"Cannot load array-of-array of composite type in tessellation IO.");
LAB_0022d8dd:
      *(undefined ***)prVar17 = &PTR__runtime_error_0048ff00;
      __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_120->basetype != Struct) {
      bVar6 = Compiler::is_matrix((Compiler *)local_f0,local_120);
      if (bVar6) {
        bVar6 = Compiler::is_array((Compiler *)local_f0,local_120);
        pCVar20 = local_f0;
        pSVar12 = local_120;
        if ((TVar2 != TypeVariable) && (bVar6)) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,
                     "Loading array of matrix from IO variable must come directly from IO variable."
                    );
LAB_0022d992:
          *(undefined ***)prVar17 = &PTR__runtime_error_0048ff00;
          __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((int)local_e8 == -1) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,"Interface index is unknown. Cannot continue.");
          goto LAB_0022d992;
        }
        if (bVar6) {
          local_f4 = CompilerGLSL::to_array_size_literal(&local_f0->super_CompilerGLSL,local_120,0);
          (*(pCVar20->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_118,pCVar20,pSVar12,0);
          puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          psVar18 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_140.field_2._M_allocated_capacity = *psVar18;
            local_140.field_2._8_8_ = puVar14[3];
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar18;
            local_140._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_140._M_string_length = puVar14[1];
          *puVar14 = psVar18;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
            operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
          }
          var = Variant::get<spirv_cross::SPIRVariable>
                          ((pCVar20->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + ptr);
          local_d8 = Compiler::get_variable_element_type((Compiler *)local_f0,var);
          if (local_f4 != 0) {
            uVar10 = 0;
            do {
              (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_118,local_f0,local_d8,0);
              puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
              psVar18 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_140.field_2._M_allocated_capacity = *psVar18;
                local_140.field_2._8_8_ = puVar14[3];
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar18;
                local_140._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_140._M_string_length = puVar14[1];
              *puVar14 = psVar18;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
                operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
              }
              if (local_120->columns != 0) {
                uVar23 = 0;
                do {
                  local_90._M_dataplus._M_p._4_4_ = (int)local_e8 + uVar23;
                  local_118.builtin = BuiltInPosition;
                  local_118.storage_physical_type = 0;
                  local_118.need_transpose = false;
                  local_118.storage_is_packed = false;
                  local_118.storage_is_invariant = false;
                  local_118.flattened_struct = false;
                  local_118.relaxed_precision = false;
                  local_118.access_meshlet_position_y = false;
                  local_118.chain_is_builtin = false;
                  local_90._M_dataplus._M_p._0_4_ = uVar10;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_140,&local_f0->super_CompilerGLSL,
                             (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,&local_118
                            );
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != &local_140.field_2) {
                    operator_delete(local_140._M_dataplus._M_p);
                  }
                  if (local_120->vecsize < local_68->vecsize) {
                    CompilerGLSL::vector_swizzle(local_120->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b0);
                  }
                  uVar23 = uVar23 + 1;
                  uVar11 = local_120->columns;
                  if (uVar23 < uVar11) {
                    ::std::__cxx11::string::append((char *)&local_b0);
                    uVar11 = local_120->columns;
                  }
                } while (uVar23 < uVar11);
              }
              ::std::__cxx11::string::append((char *)&local_b0);
              uVar10 = uVar10 + 1;
              if (uVar10 < local_f4) {
                ::std::__cxx11::string::append((char *)&local_b0);
              }
            } while (uVar10 != local_f4);
          }
          ::std::__cxx11::string::append((char *)&local_b0);
        }
        else {
          (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_118,local_f0,local_120,0);
          puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
          paVar1 = &local_140.field_2;
          psVar18 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar18) {
            local_140.field_2._M_allocated_capacity = *psVar18;
            local_140.field_2._8_8_ = puVar14[3];
            local_140._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar18;
            local_140._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_140._M_string_length = puVar14[1];
          *puVar14 = psVar18;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar1) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
            operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
          }
          if (local_120->columns != 0) {
            uVar23 = 0;
            do {
              CompilerGLSL::to_expression_abi_cxx11_
                        (&local_90,&local_f0->super_CompilerGLSL,local_dc,true);
              puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
              local_118._0_7_ = SUB87(&local_108,0);
              local_118.flattened_struct = SUB81((ulong)&local_108 >> 0x38,0);
              puVar3 = (ulong *)*puVar14;
              puVar19 = puVar14 + 2;
              if (puVar3 == puVar19) {
                local_108 = *puVar19;
                lStack_100 = puVar14[3];
              }
              else {
                local_118._0_7_ = SUB87(puVar3,0);
                local_118.flattened_struct = SUB81((ulong)puVar3 >> 0x38,0);
                local_108 = *puVar19;
              }
              uVar21 = puVar14[1];
              local_118._8_3_ = SUB83(uVar21,0);
              local_118._11_1_ = SUB81((ulong)uVar21 >> 0x18,0);
              local_118.builtin = (BuiltIn)((ulong)uVar21 >> 0x20);
              *puVar14 = puVar19;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&local_d0,&local_f0->super_CompilerGLSL,local_60,(int)local_e8 + uVar23);
              uVar24 = 0xf;
              if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
                uVar24 = local_108;
              }
              uVar16 = local_d0._M_string_length +
                       CONCAT44(local_118.builtin,CONCAT13(local_118._11_1_,local_118._8_3_));
              if (uVar24 < uVar16) {
                uVar21 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  uVar21 = local_d0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar21 < uVar16) goto LAB_0022d04e;
                puVar14 = (undefined8 *)
                          ::std::__cxx11::string::replace
                                    ((ulong)&local_d0,0,(char *)0x0,
                                     CONCAT17(local_118.flattened_struct,local_118._0_7_));
              }
              else {
LAB_0022d04e:
                puVar14 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    ((char *)&local_118,(ulong)local_d0._M_dataplus._M_p);
              }
              psVar18 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_140.field_2._M_allocated_capacity = *psVar18;
                local_140.field_2._8_8_ = puVar14[3];
                local_140._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar18;
                local_140._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_140._M_string_length = puVar14[1];
              *puVar14 = psVar18;
              puVar14[1] = 0;
              *(undefined1 *)psVar18 = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != paVar1) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
                operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint32_t)local_90._M_dataplus._M_p)
                  != &local_90.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                         (uint32_t)local_90._M_dataplus._M_p));
              }
              if (local_120->vecsize < local_68->vecsize) {
                CompilerGLSL::vector_swizzle(local_120->vecsize,0);
                ::std::__cxx11::string::append((char *)&local_b0);
              }
              uVar23 = uVar23 + 1;
              uVar11 = local_120->columns;
              if (uVar23 < uVar11) {
                ::std::__cxx11::string::append((char *)&local_b0);
                uVar11 = local_120->columns;
              }
            } while (uVar23 < uVar11);
          }
          ::std::__cxx11::string::append((char *)&local_b0);
        }
      }
      else if (TVar2 == TypeVariable) {
        bVar6 = Compiler::is_array((Compiler *)local_f0,local_120);
        pCVar20 = local_f0;
        if (!bVar6) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2101,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2102,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_e8 == -1) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,"Interface index is unknown. Cannot continue.");
          goto LAB_0022d8dd;
        }
        (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_118,local_f0,local_120,0);
        puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        paVar1 = &local_140.field_2;
        psVar18 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_140.field_2._M_allocated_capacity = *psVar18;
          local_140.field_2._8_8_ = puVar14[3];
          local_140._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar18;
          local_140._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_140._M_string_length = puVar14[1];
        *puVar14 = psVar18;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
          operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
        }
        uVar10 = CompilerGLSL::to_array_size_literal(&pCVar20->super_CompilerGLSL,local_120,0);
        if (uVar10 != 0) {
          uVar9 = 0;
          do {
            local_90._M_dataplus._M_p._4_4_ = (uint32_t)local_e8;
            local_118.builtin = BuiltInPosition;
            local_118.storage_physical_type = 0;
            local_118.need_transpose = false;
            local_118.storage_is_packed = false;
            local_118.storage_is_invariant = false;
            local_118.flattened_struct = false;
            local_118.relaxed_precision = false;
            local_118.access_meshlet_position_y = false;
            local_118.chain_is_builtin = false;
            local_90._M_dataplus._M_p._0_4_ = uVar9;
            CompilerGLSL::access_chain_internal_abi_cxx11_
                      (&local_140,&local_f0->super_CompilerGLSL,(local_f0->stage_in_ptr_var_id).id,
                       (uint32_t *)&local_90,2,5,&local_118);
            ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != paVar1) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_b0);
            }
            uVar9 = uVar9 + 1;
            if (uVar9 < uVar10) {
              ::std::__cxx11::string::append((char *)&local_b0);
            }
          } while (uVar10 != uVar9);
        }
        ::std::__cxx11::string::append((char *)&local_b0);
      }
      else {
        bVar6 = Compiler::is_array((Compiler *)local_f0,local_120);
        pCVar20 = local_f0;
        if (!bVar6) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                        ,0x211d,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                        ,0x211e,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_e8 == -1) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,"Interface index is unknown. Cannot continue.");
          goto LAB_0022d8dd;
        }
        (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_118,local_f0,local_120,0);
        puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        paVar1 = &local_140.field_2;
        psVar18 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_140.field_2._M_allocated_capacity = *psVar18;
          local_140.field_2._8_8_ = puVar14[3];
          local_140._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar18;
          local_140._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_140._M_string_length = puVar14[1];
        *puVar14 = psVar18;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
          operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
        }
        uVar10 = CompilerGLSL::to_array_size_literal(&pCVar20->super_CompilerGLSL,local_120,0);
        if (uVar10 != 0) {
          uVar23 = 0;
          do {
            CompilerGLSL::to_expression_abi_cxx11_
                      (&local_90,&local_f0->super_CompilerGLSL,local_dc,true);
            puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
            local_118._0_7_ = SUB87(&local_108,0);
            local_118.flattened_struct = SUB81((ulong)&local_108 >> 0x38,0);
            puVar3 = (ulong *)*puVar14;
            puVar19 = puVar14 + 2;
            if (puVar3 == puVar19) {
              local_108 = *puVar19;
              lStack_100 = puVar14[3];
            }
            else {
              local_118._0_7_ = SUB87(puVar3,0);
              local_118.flattened_struct = SUB81((ulong)puVar3 >> 0x38,0);
              local_108 = *puVar19;
            }
            uVar21 = puVar14[1];
            local_118._8_3_ = SUB83(uVar21,0);
            local_118._11_1_ = SUB81((ulong)uVar21 >> 0x18,0);
            local_118.builtin = (BuiltIn)((ulong)uVar21 >> 0x20);
            *puVar14 = puVar19;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_d0,&local_f0->super_CompilerGLSL,local_60,(int)local_e8 + uVar23);
            uVar24 = 0xf;
            if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
              uVar24 = local_108;
            }
            uVar16 = local_d0._M_string_length +
                     CONCAT44(local_118.builtin,CONCAT13(local_118._11_1_,local_118._8_3_));
            if (uVar24 < uVar16) {
              uVar21 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                uVar21 = local_d0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < uVar16) goto LAB_0022d6a8;
              puVar14 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_d0,0,(char *)0x0,
                                   CONCAT17(local_118.flattened_struct,local_118._0_7_));
            }
            else {
LAB_0022d6a8:
              puVar14 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_118,(ulong)local_d0._M_dataplus._M_p);
            }
            psVar18 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_140.field_2._M_allocated_capacity = *psVar18;
              local_140.field_2._8_8_ = puVar14[3];
              local_140._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar18;
              local_140._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_140._M_string_length = puVar14[1];
            *puVar14 = psVar18;
            puVar14[1] = 0;
            *(undefined1 *)psVar18 = 0;
            ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != paVar1) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
              operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint32_t)local_90._M_dataplus._M_p) !=
                &local_90.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_90._M_dataplus._M_p));
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_b0);
            }
            uVar23 = uVar23 + 1;
            if (uVar23 < uVar10) {
              ::std::__cxx11::string::append((char *)&local_b0);
            }
          } while (uVar10 != uVar23);
        }
        ::std::__cxx11::string::append((char *)&local_b0);
      }
      goto LAB_0022d7c3;
    }
    bVar6 = Compiler::is_array((Compiler *)local_f0,local_120);
    pSVar12 = local_120;
    local_f4 = CONCAT31(local_f4._1_3_,bVar6);
    if ((TVar2 != TypeVariable) && (bVar6)) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar17,
                 "Loading array of struct from IO variable must come directly from IO variable.");
      *(undefined ***)prVar17 = &PTR__runtime_error_0048ff00;
      __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar6) {
      local_6c = CompilerGLSL::to_array_size_literal(&pCVar20->super_CompilerGLSL,local_120,0);
      (*(pCVar20->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_118,pCVar20,pSVar12,0);
      puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
      psVar18 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_140.field_2._M_allocated_capacity = *psVar18;
        local_140.field_2._8_8_ = puVar14[3];
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar18;
        local_140._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_140._M_string_length = puVar14[1];
      *puVar14 = psVar18;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
        operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
      }
      local_120 = Variant::get<spirv_cross::SPIRType>
                            ((pCVar20->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (local_120->parent_type).id);
      if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 0) {
LAB_0022d939:
        __assert_fail("struct_type.array.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp"
                      ,0x206d,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                     );
      }
      if (local_6c != 0) goto LAB_0022c364;
    }
    else {
      local_6c = 1;
      if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 0) goto LAB_0022d939;
LAB_0022c364:
      local_d8 = (SPIRType *)((ulong)local_d8 & 0xffffffff00000000);
      pCVar20 = local_f0;
      do {
        (*(pCVar20->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_118,pCVar20,local_120,0);
        puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar18 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_140.field_2._M_allocated_capacity = *psVar18;
          local_140.field_2._8_8_ = puVar14[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar18;
          local_140._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_140._M_string_length = puVar14[1];
        *puVar14 = psVar18;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
          operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
        }
        if ((int)(local_120->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0) {
          uVar24 = 0;
          do {
            if (local_40 != (SPIRVariable *)0x0) {
              uVar10 = Compiler::get_extended_member_decoration
                                 ((Compiler *)pCVar20,(local_40->super_IVariant).self.id,
                                  (uint32_t)uVar24,SPIRVCrossDecorationInterfaceMemberIndex);
              local_e8 = CONCAT44(extraout_var_00,uVar10);
            }
            if ((int)local_e8 == -1) {
              prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error
                        (prVar17,"Interface index is unknown. Cannot continue.");
              *(undefined ***)prVar17 = &PTR__runtime_error_0048ff00;
              __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            pSVar12 = Variant::get<spirv_cross::SPIRType>
                                ((pCVar20->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (local_120->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [uVar24].id);
            local_38 = uVar24;
            pSVar13 = Variant::get<spirv_cross::SPIRType>
                                ((pCVar20->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (local_68->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [uVar24].id);
            bVar6 = Compiler::is_matrix((Compiler *)pCVar20,pSVar12);
            if (bVar6 && local_50->storage == Input) {
              (*(pCVar20->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_118,pCVar20,pSVar12,0);
              puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              psVar18 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_140.field_2._M_allocated_capacity = *psVar18;
                local_140.field_2._8_8_ = puVar14[3];
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar18;
                local_140._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_140._M_string_length = puVar14[1];
              *puVar14 = psVar18;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
                operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
              }
              if (pSVar12->columns != 0) {
                uVar23 = 0;
                do {
                  uVar10 = (int)local_e8 + uVar23;
                  if ((char)local_f4 == '\0') {
                    CompilerGLSL::to_expression_abi_cxx11_
                              (&local_90,&pCVar20->super_CompilerGLSL,local_dc,true);
                    plVar15 = (long *)::std::__cxx11::string::append((char *)&local_90);
                    local_118._0_7_ = SUB87(&local_108,0);
                    local_118.flattened_struct = SUB81((ulong)&local_108 >> 0x38,0);
                    puVar3 = (ulong *)*plVar15;
                    puVar19 = (ulong *)(plVar15 + 2);
                    if (puVar3 == puVar19) {
                      local_108 = *puVar19;
                      lStack_100 = plVar15[3];
                    }
                    else {
                      local_118._0_7_ = SUB87(puVar3,0);
                      local_118.flattened_struct = SUB81((ulong)puVar3 >> 0x38,0);
                      local_108 = *puVar19;
                    }
                    lVar4 = plVar15[1];
                    local_118._8_3_ = SUB83(lVar4,0);
                    local_118._11_1_ = SUB81((ulong)lVar4 >> 0x18,0);
                    local_118.builtin = (BuiltIn)((ulong)lVar4 >> 0x20);
                    *plVar15 = (long)puVar19;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    CompilerGLSL::to_member_name_abi_cxx11_
                              (&local_d0,&pCVar20->super_CompilerGLSL,local_60,uVar10);
                    uVar24 = 0xf;
                    if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108)
                    {
                      uVar24 = local_108;
                    }
                    uVar16 = local_d0._M_string_length +
                             CONCAT44(local_118.builtin,CONCAT13(local_118._11_1_,local_118._8_3_));
                    if (uVar24 < uVar16) {
                      uVar21 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                        uVar21 = local_d0.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar21 < uVar16) goto LAB_0022c7f6;
                      puVar14 = (undefined8 *)
                                ::std::__cxx11::string::replace
                                          ((ulong)&local_d0,0,(char *)0x0,
                                           CONCAT17(local_118.flattened_struct,local_118._0_7_));
                    }
                    else {
LAB_0022c7f6:
                      puVar14 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          ((char *)&local_118,(ulong)local_d0._M_dataplus._M_p);
                    }
                    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                    psVar18 = puVar14 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar14 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar18) {
                      local_140.field_2._M_allocated_capacity = *psVar18;
                      local_140.field_2._8_8_ = puVar14[3];
                    }
                    else {
                      local_140.field_2._M_allocated_capacity = *psVar18;
                      local_140._M_dataplus._M_p = (pointer)*puVar14;
                    }
                    local_140._M_string_length = puVar14[1];
                    *puVar14 = psVar18;
                    puVar14[1] = 0;
                    *(undefined1 *)psVar18 = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                      operator_delete(local_140._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      operator_delete(local_d0._M_dataplus._M_p);
                    }
                    if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108)
                    {
                      operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_))
                      ;
                    }
                    _Var22._M_p = (pointer)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                    (uint32_t)local_90._M_dataplus._M_p);
                    psVar5 = &local_90;
                  }
                  else {
                    local_90._M_dataplus._M_p._0_4_ = (uint)local_d8;
                    local_118.builtin = BuiltInPosition;
                    local_118.storage_physical_type = 0;
                    local_118.need_transpose = false;
                    local_118.storage_is_packed = false;
                    local_118.storage_is_invariant = false;
                    local_118.flattened_struct = false;
                    local_118.relaxed_precision = false;
                    local_118.access_meshlet_position_y = false;
                    local_118.chain_is_builtin = false;
                    local_90._M_dataplus._M_p._4_4_ = uVar10;
                    CompilerGLSL::access_chain_internal_abi_cxx11_
                              (&local_140,&pCVar20->super_CompilerGLSL,
                               (pCVar20->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,
                               &local_118);
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                    psVar5 = &local_140;
                    _Var22._M_p = local_140._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var22._M_p != &psVar5->field_2) {
                    operator_delete(_Var22._M_p);
                  }
                  if (pSVar12->vecsize < pSVar13->vecsize) {
                    CompilerGLSL::vector_swizzle(pSVar12->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b0);
                  }
                  uVar23 = uVar23 + 1;
                  uVar11 = pSVar12->columns;
                  if (uVar23 < uVar11) {
                    ::std::__cxx11::string::append((char *)&local_b0);
                    uVar11 = pSVar12->columns;
                  }
                } while (uVar23 < uVar11);
                local_e8 = (ulong)((int)local_e8 + uVar23);
              }
              ::std::__cxx11::string::append((char *)&local_b0);
            }
            else {
              bVar6 = Compiler::is_array((Compiler *)pCVar20,pSVar12);
              if (bVar6) {
                (*(pCVar20->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_118,pCVar20,pSVar12,0);
                puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                psVar18 = puVar14 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_140.field_2._M_allocated_capacity = *psVar18;
                  local_140.field_2._8_8_ = puVar14[3];
                }
                else {
                  local_140.field_2._M_allocated_capacity = *psVar18;
                  local_140._M_dataplus._M_p = (pointer)*puVar14;
                }
                local_140._M_string_length = puVar14[1];
                *puVar14 = psVar18;
                puVar14[1] = 0;
                *(undefined1 *)(puVar14 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  operator_delete(local_140._M_dataplus._M_p);
                }
                if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
                  operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
                }
                uVar10 = CompilerGLSL::to_array_size_literal(&pCVar20->super_CompilerGLSL,pSVar12,0)
                ;
                if (uVar10 != 0) {
                  uVar23 = 1;
                  do {
                    if ((char)local_f4 == '\0') {
                      CompilerGLSL::to_expression_abi_cxx11_
                                (&local_90,&local_f0->super_CompilerGLSL,local_dc,true);
                      puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
                      local_118._0_7_ = SUB87(&local_108,0);
                      local_118.flattened_struct = SUB81((ulong)&local_108 >> 0x38,0);
                      puVar3 = (ulong *)*puVar14;
                      puVar19 = puVar14 + 2;
                      if (puVar3 == puVar19) {
                        local_108 = *puVar19;
                        lStack_100 = puVar14[3];
                      }
                      else {
                        local_118._0_7_ = SUB87(puVar3,0);
                        local_118.flattened_struct = SUB81((ulong)puVar3 >> 0x38,0);
                        local_108 = *puVar19;
                      }
                      uVar21 = puVar14[1];
                      local_118._8_3_ = SUB83(uVar21,0);
                      local_118._11_1_ = SUB81((ulong)uVar21 >> 0x18,0);
                      local_118.builtin = (BuiltIn)((ulong)uVar21 >> 0x20);
                      *puVar14 = puVar19;
                      puVar14[1] = 0;
                      *(undefined1 *)(puVar14 + 2) = 0;
                      CompilerGLSL::to_member_name_abi_cxx11_
                                (&local_d0,&local_f0->super_CompilerGLSL,local_60,(uint32_t)local_e8
                                );
                      uVar24 = 0xf;
                      if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) !=
                          &local_108) {
                        uVar24 = local_108;
                      }
                      uVar16 = local_d0._M_string_length +
                               CONCAT44(local_118.builtin,CONCAT13(local_118._11_1_,local_118._8_3_)
                                       );
                      if (uVar24 < uVar16) {
                        uVar21 = 0xf;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                          uVar21 = local_d0.field_2._M_allocated_capacity;
                        }
                        if ((ulong)uVar21 < uVar16) goto LAB_0022cb7d;
                        puVar14 = (undefined8 *)
                                  ::std::__cxx11::string::replace
                                            ((ulong)&local_d0,0,(char *)0x0,
                                             CONCAT17(local_118.flattened_struct,local_118._0_7_));
                      }
                      else {
LAB_0022cb7d:
                        puVar14 = (undefined8 *)
                                  ::std::__cxx11::string::_M_append
                                            ((char *)&local_118,(ulong)local_d0._M_dataplus._M_p);
                      }
                      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                      psVar18 = puVar14 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar14 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar18) {
                        local_140.field_2._M_allocated_capacity = *psVar18;
                        local_140.field_2._8_8_ = puVar14[3];
                      }
                      else {
                        local_140.field_2._M_allocated_capacity = *psVar18;
                        local_140._M_dataplus._M_p = (pointer)*puVar14;
                      }
                      local_140._M_string_length = puVar14[1];
                      *puVar14 = psVar18;
                      puVar14[1] = 0;
                      *(undefined1 *)psVar18 = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_140._M_dataplus._M_p != &local_140.field_2) {
                        operator_delete(local_140._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                        operator_delete(local_d0._M_dataplus._M_p);
                      }
                      if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) !=
                          &local_108) {
                        operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_
                                                         ));
                      }
                      _Var22._M_p = (pointer)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                      (uint32_t)local_90._M_dataplus._M_p);
                      psVar5 = &local_90;
                    }
                    else {
                      local_90._M_dataplus._M_p._0_4_ = (uint)local_d8;
                      local_90._M_dataplus._M_p._4_4_ = (uint32_t)local_e8;
                      local_118.builtin = BuiltInPosition;
                      local_118.storage_physical_type = 0;
                      local_118.need_transpose = false;
                      local_118.storage_is_packed = false;
                      local_118.storage_is_invariant = false;
                      local_118.flattened_struct = false;
                      local_118.relaxed_precision = false;
                      local_118.access_meshlet_position_y = false;
                      local_118.chain_is_builtin = false;
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                (&local_140,&local_f0->super_CompilerGLSL,
                                 (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,
                                 &local_118);
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                      psVar5 = &local_140;
                      _Var22._M_p = local_140._M_dataplus._M_p;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var22._M_p != &psVar5->field_2) {
                      operator_delete(_Var22._M_p);
                    }
                    if (pSVar12->vecsize < pSVar13->vecsize) {
                      CompilerGLSL::vector_swizzle(pSVar12->vecsize,0);
                      ::std::__cxx11::string::append((char *)&local_b0);
                    }
                    if (uVar23 < uVar10) {
                      ::std::__cxx11::string::append((char *)&local_b0);
                    }
                    local_e8 = (ulong)((int)local_e8 + 1);
                    bVar6 = uVar23 != uVar10;
                    uVar23 = uVar23 + 1;
                  } while (bVar6);
                }
                ::std::__cxx11::string::append((char *)&local_b0);
                pCVar20 = local_f0;
              }
              else {
                if ((char)local_f4 == '\0') {
                  CompilerGLSL::to_expression_abi_cxx11_
                            (&local_90,&pCVar20->super_CompilerGLSL,local_dc,true);
                  puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
                  local_118._0_7_ = SUB87(&local_108,0);
                  local_118.flattened_struct = SUB81((ulong)&local_108 >> 0x38,0);
                  puVar3 = (ulong *)*puVar14;
                  puVar19 = puVar14 + 2;
                  if (puVar3 == puVar19) {
                    local_108 = *puVar19;
                    lStack_100 = puVar14[3];
                  }
                  else {
                    local_118._0_7_ = SUB87(puVar3,0);
                    local_118.flattened_struct = SUB81((ulong)puVar3 >> 0x38,0);
                    local_108 = *puVar19;
                  }
                  uVar21 = puVar14[1];
                  local_118._8_3_ = SUB83(uVar21,0);
                  local_118._11_1_ = SUB81((ulong)uVar21 >> 0x18,0);
                  local_118.builtin = (BuiltIn)((ulong)uVar21 >> 0x20);
                  *puVar14 = puVar19;
                  puVar14[1] = 0;
                  *(undefined1 *)(puVar14 + 2) = 0;
                  CompilerGLSL::to_member_name_abi_cxx11_
                            (&local_d0,&pCVar20->super_CompilerGLSL,local_60,(uint32_t)local_e8);
                  uVar24 = 0xf;
                  if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
                    uVar24 = local_108;
                  }
                  uVar16 = local_d0._M_string_length +
                           CONCAT44(local_118.builtin,CONCAT13(local_118._11_1_,local_118._8_3_));
                  if (uVar24 < uVar16) {
                    uVar21 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      uVar21 = local_d0.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar21 < uVar16) goto LAB_0022cd53;
                    puVar14 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)&local_d0,0,(char *)0x0,
                                         CONCAT17(local_118.flattened_struct,local_118._0_7_));
                  }
                  else {
LAB_0022cd53:
                    puVar14 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)&local_118,(ulong)local_d0._M_dataplus._M_p);
                  }
                  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                  psVar18 = puVar14 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar14 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar18) {
                    local_140.field_2._M_allocated_capacity = *psVar18;
                    local_140.field_2._8_8_ = puVar14[3];
                  }
                  else {
                    local_140.field_2._M_allocated_capacity = *psVar18;
                    local_140._M_dataplus._M_p = (pointer)*puVar14;
                  }
                  local_140._M_string_length = puVar14[1];
                  *puVar14 = psVar18;
                  puVar14[1] = 0;
                  *(undefined1 *)psVar18 = 0;
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != &local_140.field_2) {
                    operator_delete(local_140._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                    operator_delete(local_d0._M_dataplus._M_p);
                  }
                  if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
                    operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
                  }
                  _Var22._M_p = (pointer)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                  (uint32_t)local_90._M_dataplus._M_p);
                  psVar5 = &local_90;
                }
                else {
                  local_90._M_dataplus._M_p._0_4_ = (uint)local_d8;
                  local_90._M_dataplus._M_p._4_4_ = (uint32_t)local_e8;
                  local_118.builtin = BuiltInPosition;
                  local_118.storage_physical_type = 0;
                  local_118.need_transpose = false;
                  local_118.storage_is_packed = false;
                  local_118.storage_is_invariant = false;
                  local_118.flattened_struct = false;
                  local_118.relaxed_precision = false;
                  local_118.access_meshlet_position_y = false;
                  local_118.chain_is_builtin = false;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_140,&pCVar20->super_CompilerGLSL,
                             (pCVar20->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,&local_118)
                  ;
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                  psVar5 = &local_140;
                  _Var22._M_p = local_140._M_dataplus._M_p;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var22._M_p != &psVar5->field_2) {
                  operator_delete(_Var22._M_p);
                }
                if (pSVar12->vecsize < pSVar13->vecsize) {
                  CompilerGLSL::vector_swizzle(pSVar12->vecsize,0);
                  ::std::__cxx11::string::append((char *)&local_b0);
                }
              }
            }
            uVar24 = local_38 + 1;
            uVar16 = (local_120->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
            if (uVar24 < uVar16) {
              ::std::__cxx11::string::append((char *)&local_b0);
              uVar16 = (ulong)(uint)(local_120->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                    buffer_size;
            }
          } while (uVar24 < (uVar16 & 0xffffffff));
        }
        ::std::__cxx11::string::append((char *)&local_b0);
        uVar23 = (uint)local_d8 + 1;
        local_d8 = (SPIRType *)CONCAT44(local_d8._4_4_,uVar23);
        if (uVar23 < local_6c) {
          ::std::__cxx11::string::append((char *)&local_b0);
        }
      } while ((uint)local_d8 != local_6c);
      if ((char)local_f4 == '\0') goto LAB_0022d7c3;
    }
    ::std::__cxx11::string::append((char *)&local_b0);
  }
  else {
    if ((int)local_e8 == -1) {
      bVar6 = false;
      goto LAB_0022d803;
    }
    (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&local_118,local_f0,local_120,0);
    puVar14 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
    paVar1 = &local_140.field_2;
    psVar18 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_140.field_2._M_allocated_capacity = *psVar18;
      local_140.field_2._8_8_ = puVar14[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar18;
      local_140._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_140._M_string_length = puVar14[1];
    *puVar14 = psVar18;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_) != &local_108) {
      operator_delete((ulong *)CONCAT17(local_118.flattened_struct,local_118._0_7_));
    }
    uVar10 = CompilerGLSL::to_array_size_literal
                       (&pCVar20->super_CompilerGLSL,local_120,
                        (int)(local_120->array).super_VectorView<unsigned_int>.buffer_size - 1);
    if (uVar10 != 0) {
      uVar9 = 0;
      do {
        local_90._M_dataplus._M_p._4_4_ = (uint32_t)local_e8;
        local_118.builtin = BuiltInPosition;
        local_118.storage_physical_type = 0;
        local_118.need_transpose = false;
        local_118.storage_is_packed = false;
        local_118.storage_is_invariant = false;
        local_118.flattened_struct = false;
        local_118.relaxed_precision = false;
        local_118.access_meshlet_position_y = false;
        local_118.chain_is_builtin = false;
        local_90._M_dataplus._M_p._0_4_ = uVar9;
        CompilerGLSL::access_chain_internal_abi_cxx11_
                  (&local_140,&local_f0->super_CompilerGLSL,(local_f0->stage_in_ptr_var_id).id,
                   (uint32_t *)&local_90,2,5,&local_118);
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        uVar9 = uVar9 + 1;
        if (uVar9 < uVar10) {
          ::std::__cxx11::string::append((char *)&local_b0);
        }
      } while (uVar10 != uVar9);
    }
    ::std::__cxx11::string::append((char *)&local_b0);
  }
LAB_0022d7c3:
  pCVar20 = local_f0;
  CompilerGLSL::emit_op(&local_f0->super_CompilerGLSL,local_44,local_54,&local_b0,false,false);
  bVar6 = true;
  Compiler::register_read((Compiler *)pCVar20,local_54,local_dc,false);
LAB_0022d803:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
    return bVar6;
  }
  return bVar6;
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && is_tese_shader())
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;

	bool flattened_io = variable_storage_requires_stage_io(ptr_type.storage);

	bool flat_data_type = flattened_io &&
	                      (is_matrix(result_type) || is_array(result_type) || result_type.basetype == SPIRType::Struct);

	// Edge case, even with multi-patch workgroups, we still need to unroll load
	// if we're loading control points directly.
	if (ptr_is_io_variable && is_array(result_type))
		flat_data_type = true;

	if (!flat_data_type)
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (!flattened_io)
	{
		// Simplest case for multi-patch workgroups, just unroll array as-is.
		if (interface_index == uint32_t(-1))
			return false;

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, uint32_t(result_type.array.size()) - 1);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };
			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || is_matrix(result_type))
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			for (uint32_t j = 0; j < array_size; j++, interface_index++)
			{
				const uint32_t indices[2] = { i, interface_index };

				AccessChainMeta meta;
				expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
				                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
				if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					expr_type.vecsize > sub_type.vecsize)
					expr += vector_swizzle(sub_type.vecsize, 0);

				if (j + 1 < array_size)
					expr += ", ";
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.basetype == SPIRType::Struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					for (uint32_t k = 0; k < array_size; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < array_size)
							expr += ", ";
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (is_matrix(result_type))
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}